

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderToolsCommon.cpp
# Opt level: O2

string * Diligent::UnrollShaderIncludesImpl
                   (string *__return_storage_ptr__,ShaderCreateInfo ShaderCI,
                   unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *AllIncludes)

{
  char cVar1;
  char cVar2;
  anon_union_8_2_8aa5a88c_for_ShaderCreateInfo_4 aVar3;
  string *psVar4;
  int iVar5;
  char *pcVar6;
  char *pcVar7;
  undefined8 *puVar8;
  long lVar9;
  char *pcVar10;
  ShaderMacroArray *pSVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  **ppaVar12;
  Char *pCVar13;
  byte bVar14;
  __ireturn_type _Var15;
  ShaderCreateInfo in_stack_fffffffffffffbd8;
  char *local_388;
  char *pBufferEnd;
  Char *local_378;
  char *local_370;
  char *local_368;
  _Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *local_360;
  value_type local_358;
  ShaderMacroArray *local_338;
  string *local_330;
  ShaderSourceFileData SourceData;
  string UnrolledInclude;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2f0;
  IShaderSourceInputStreamFactory *local_2e8;
  undefined8 local_2e0;
  void *local_2d8;
  undefined8 local_2d0;
  undefined8 local_2c8 [14];
  code *local_258;
  undefined1 local_250 [152];
  stringstream Stream;
  ostream local_1a8 [376];
  
  bVar14 = 0;
  local_330 = __return_storage_ptr__;
  ReadShaderSourceFile(&SourceData,&ShaderCI);
  ShaderCI.Source = SourceData.Source;
  ShaderCI.field_4.SourceLength._4_4_ = 0;
  ShaderCI.field_4.SourceLength._0_4_ = SourceData.SourceLength;
  ShaderCI.FilePath = (Char *)0x0;
  std::__cxx11::stringstream::stringstream((stringstream *)&Stream);
  aVar3 = ShaderCI.field_4;
  pCVar13 = ShaderCI.Source;
  local_258 = ProcessIncludeErrorHandler;
  memcpy(local_250,&ShaderCI,0x98);
  if (aVar3.SourceLength == 0) {
    pcVar10 = (char *)0x0;
  }
  else {
    local_388 = pCVar13;
    pBufferEnd = pCVar13 + aVar3.SourceLength;
    local_338 = (ShaderMacroArray *)&ShaderCI.EntryPoint;
    local_368 = (char *)0x0;
    local_378 = pCVar13;
    pcVar7 = pBufferEnd;
    local_360 = (_Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)AllIncludes;
    while ((pcVar10 = local_368, pCVar13 = ShaderCI.Source, local_388 < pcVar7 &&
           (pcVar6 = Parsing::SkipDelimitersAndComments<char_const*>
                               (&local_388,&pBufferEnd,(char *)0x0,SKIP_COMMENT_FLAG_ALL),
           pcVar10 = local_368, pCVar13 = ShaderCI.Source, local_388 = pcVar6, pcVar6 != pBufferEnd)
           )) {
      if (*pcVar6 == '#') {
        local_370 = Parsing::SkipLine<char_const*>(&local_388,&pBufferEnd,false);
        local_2f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(pcVar6 + 1);
        pcVar6 = Parsing::SkipDelimitersAndComments<char_const*>
                           ((char **)&local_2f0,&pBufferEnd," \t",SKIP_COMMENT_FLAG_MULTILINE);
        pcVar7 = pBufferEnd;
        pcVar10 = local_368;
        pCVar13 = ShaderCI.Source;
        local_388 = pcVar6;
        if (pcVar6 == pBufferEnd) break;
        if (pcVar6 < local_370) {
          iVar5 = strncmp(pcVar6,"include",7);
          if (iVar5 == 0) {
            local_388 = pcVar6 + 7;
            pcVar7 = Parsing::SkipDelimitersAndComments<char_const*>
                               (&local_388,&pBufferEnd," \t",SKIP_COMMENT_FLAG_MULTILINE);
            pcVar10 = local_370;
            if (pcVar7 == pBufferEnd) {
              puVar8 = (undefined8 *)__cxa_allocate_exception(0x10);
              *puVar8 = local_388;
              puVar8[1] = "Unexpected end of file.";
              __cxa_throw(puVar8,&std::pair<char_const*,char_const*>::typeinfo,0);
            }
            if (local_370 <= pcVar7) {
              puVar8 = (undefined8 *)__cxa_allocate_exception(0x10);
              *puVar8 = pcVar10;
              puVar8[1] = "New line in the include directive.";
              __cxa_throw(puVar8,&std::pair<char_const*,char_const*>::typeinfo,0);
            }
            cVar1 = *pcVar7;
            local_388 = pcVar7;
            if (((pcVar7 < pBufferEnd) && (cVar1 != '\"')) && (cVar1 != '<')) {
              puVar8 = (undefined8 *)__cxa_allocate_exception(0x10);
              *puVar8 = local_388;
              puVar8[1] = "\'<\' or \'\"\' is expected";
              __cxa_throw(puVar8,&std::pair<char_const*,char_const*>::typeinfo,0);
            }
            cVar2 = '\"';
            if (cVar1 == '<') {
              cVar2 = '>';
            }
            do {
              local_388 = local_388 + 1;
              if (pBufferEnd <= local_388) break;
            } while (cVar2 != *local_388);
            if (local_388 == pBufferEnd) {
              puVar8 = (undefined8 *)__cxa_allocate_exception(0x10);
              pcVar10 = "Unable to find the matching closing quote";
              if (cVar1 == '<') {
                pcVar10 = "Unable to find the matching angle bracket";
              }
              *puVar8 = pcVar7;
              puVar8[1] = pcVar10;
              __cxa_throw(puVar8,&std::pair<char_const*,char_const*>::typeinfo,0);
            }
            if (local_370 <= local_388) {
              puVar8 = (undefined8 *)__cxa_allocate_exception(0x10);
              *puVar8 = pcVar10;
              puVar8[1] = "New line in the file name.";
              __cxa_throw(puVar8,&std::pair<char_const*,char_const*>::typeinfo,0);
            }
            local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_358,pcVar7 + 1);
            pcVar10 = local_388;
            std::ostream::write((char *)local_1a8,(long)(ShaderCI.Source + (long)local_368));
            _Var15 = std::__detail::
                     _Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     ::insert(local_360,&local_358);
            if (((undefined1  [16])_Var15 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              pSVar11 = local_338;
              puVar8 = local_2c8;
              for (lVar9 = 0xe; lVar9 != 0; lVar9 = lVar9 + -1) {
                *puVar8 = pSVar11->Elements;
                pSVar11 = (ShaderMacroArray *)&pSVar11[-(ulong)bVar14].Count;
                puVar8 = puVar8 + (ulong)bVar14 * -2 + 1;
              }
              local_2f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_358._M_dataplus._M_p;
              local_2e8 = ShaderCI.pShaderSourceStreamFactory;
              local_2e0 = 0;
              local_2d8 = ShaderCI.ByteCode;
              local_2d0 = 0;
              ppaVar12 = &local_2f0;
              puVar8 = (undefined8 *)&stack0xfffffffffffffbd8;
              for (lVar9 = 0x13; lVar9 != 0; lVar9 = lVar9 + -1) {
                *puVar8 = *ppaVar12;
                ppaVar12 = ppaVar12 + (ulong)bVar14 * -2 + 1;
                puVar8 = puVar8 + (ulong)bVar14 * -2 + 1;
              }
              UnrollShaderIncludesImpl
                        (&UnrolledInclude,in_stack_fffffffffffffbd8,
                         (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_360);
              std::operator<<(local_1a8,(string *)&UnrolledInclude);
              std::__cxx11::string::~string((string *)&UnrolledInclude);
            }
            lVar9 = 1 - (long)local_378;
            std::__cxx11::string::~string((string *)&local_358);
            local_388 = local_388 + 1;
            pcVar7 = pBufferEnd;
            local_368 = pcVar10 + lVar9;
          }
          else {
            local_388 = local_370;
          }
        }
      }
      else {
        pcVar7 = pBufferEnd;
        local_388 = pcVar6 + 1;
      }
    }
  }
  std::ostream::write((char *)local_1a8,(long)(pCVar13 + (long)pcVar10));
  psVar4 = local_330;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&Stream);
  RefCntAutoPtr<Diligent::IDataBlob>::Release(&SourceData.pFileData);
  return psVar4;
}

Assistant:

static std::string UnrollShaderIncludesImpl(ShaderCreateInfo ShaderCI, std::unordered_set<std::string>& AllIncludes) noexcept(false)
{
    const auto SourceData = ReadShaderSourceFile(ShaderCI);

    ShaderCI.Source       = SourceData.Source;
    ShaderCI.SourceLength = SourceData.SourceLength;
    ShaderCI.FilePath     = nullptr;

    std::stringstream Stream;
    size_t            PrevIncludeEnd = 0;

    FindIncludes(
        ShaderCI.Source, ShaderCI.SourceLength, [&](const std::string& Path, size_t IncludeStart, size_t IncludeEnd) {
            // Insert text before the include start
            Stream.write(ShaderCI.Source + PrevIncludeEnd, IncludeStart - PrevIncludeEnd);

            if (AllIncludes.insert(Path).second)
            {
                // Process the #include directive
                ShaderCreateInfo IncludeCI{ShaderCI};
                IncludeCI.Source       = nullptr;
                IncludeCI.SourceLength = 0;
                IncludeCI.FilePath     = Path.c_str();
                auto UnrolledInclude   = UnrollShaderIncludesImpl(IncludeCI, AllIncludes);
                Stream << UnrolledInclude;
            }

            PrevIncludeEnd = IncludeEnd;
        },
        std::bind(ProcessIncludeErrorHandler, ShaderCI, std::placeholders::_1));

    // Insert text after the last include
    Stream.write(ShaderCI.Source + PrevIncludeEnd, ShaderCI.SourceLength - PrevIncludeEnd);

    return Stream.str();
}